

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O1

yajl_gen_status yajl_gen_null(yajl_gen g)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  size_t sVar3;
  uint uVar4;
  char *pcVar5;
  
  switch(g->state[g->depth]) {
  case yajl_gen_map_start:
  case yajl_gen_map_key:
    return yajl_gen_keys_must_be_strings;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto switchD_00105a78_caseD_4;
    pcVar5 = " ";
    break;
  default:
    goto switchD_00105a78_caseD_4;
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) == 0) goto switchD_00105a78_caseD_4;
    pcVar5 = "\n";
    break;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  (*g->print)(g->ctx,pcVar5,1);
switchD_00105a78_caseD_4:
  if ((((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val)) && (g->depth != 0)) {
    uVar4 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar5 = g->indentString;
      sVar3 = strlen(pcVar5);
      (*p_Var1)(pvVar2,pcVar5,sVar3 & 0xffffffff);
      uVar4 = uVar4 + 1;
    } while (uVar4 < g->depth);
  }
  (*g->print)(g->ctx,"null",4);
  uVar4 = g->depth;
  if ((ulong)g->state[uVar4] < 5) {
    g->state[uVar4] = *(yajl_gen_state *)(&DAT_001079b8 + (ulong)g->state[uVar4] * 4);
  }
  if (((g->flags & 1) != 0) && (g->state[uVar4] == yajl_gen_complete)) {
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_null(yajl_gen g)
{
    ENSURE_VALID_STATE; ENSURE_NOT_KEY; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, "null", strlen("null"));
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}